

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O2

int lws_return_http_status(lws *wsi,uint code,char *html_body)

{
  uchar *end;
  uchar *loc;
  int iVar1;
  uint uVar2;
  int iVar3;
  lws_context *plVar4;
  size_t sVar5;
  char *pcVar6;
  uchar *buf;
  uchar *puVar7;
  uchar *p;
  uchar *local_58;
  ulong local_50;
  char slen [20];
  
  plVar4 = lws_get_context(wsi);
  puVar7 = plVar4->pt[wsi->tsi].serv_buf;
  p = puVar7 + 0x10;
  if (wsi->vhost == (lws_vhost *)0x0) {
    _lws_log(1,"%s: wsi not bound to vhost\n","lws_return_http_status");
  }
  else {
    local_50 = (ulong)plVar4->pt_serv_buf_size;
    end = puVar7 + local_50;
    buf = p;
    if (((wsi->field_0x2e0 & 2) == 0) &&
       (loc = (uchar *)(wsi->vhost->http).error_document_404, code == 0x194 && loc != (uchar *)0x0))
    {
      local_58 = p;
      sVar5 = strlen((char *)loc);
      iVar1 = lws_http_redirect(wsi,0x12e,loc,(int)sVar5,&p,end);
      buf = local_58;
      if (0 < iVar1) {
        return 0;
      }
    }
    pcVar6 = "";
    if (html_body != (char *)0x0) {
      pcVar6 = html_body;
    }
    p = buf;
    iVar1 = lws_add_http_header_status(wsi,code,&p,end);
    if ((iVar1 == 0) &&
       (iVar1 = lws_add_http_header_by_token
                          (wsi,WSI_TOKEN_HTTP_CONTENT_TYPE,(uchar *)"text/html",9,&p,end),
       iVar1 == 0)) {
      puVar7 = puVar7 + (local_50 - 0x1f0);
      uVar2 = lws_snprintf((char *)puVar7,0x1fe,
                           "<html><head><meta charset=utf-8 http-equiv=\"Content-Language\" content=\"en\"/><link rel=\"stylesheet\" type=\"text/css\" href=\"/error.css\"/></head><body><h1>%u</h1>%s</body></html>"
                           ,code,pcVar6);
      iVar1 = lws_snprintf(slen,0xc,"%d",(ulong)uVar2);
      iVar1 = lws_add_http_header_by_token
                        (wsi,WSI_TOKEN_HTTP_CONTENT_LENGTH,(uchar *)slen,iVar1,&p,end);
      if (iVar1 == 0) {
        iVar1 = lws_finalize_http_header(wsi,&p,end);
        if (iVar1 != 0) {
          return 1;
        }
        iVar1 = (int)p - (int)buf;
        if ((wsi->field_0x2dc & 2) == 0) {
          iVar1 = iVar1 + uVar2;
          memcpy(p,puVar7,(long)(int)uVar2);
          iVar3 = lws_write(wsi,buf,(long)iVar1,LWS_WRITE_HTTP);
          return (uint)(iVar3 != iVar1);
        }
        iVar1 = lws_write(wsi,buf,(long)iVar1,LWS_WRITE_HTTP_HEADERS);
        if (iVar1 != (int)p - (int)buf) {
          return 1;
        }
        (wsi->http).tx_content_length = (long)(int)uVar2;
        (wsi->http).tx_content_remain = (long)(int)uVar2;
        pcVar6 = (char *)lws_realloc((void *)0x0,(long)(int)(uVar2 + 0x11),"pending status body");
        (wsi->h2).pending_status_body = pcVar6;
        if (pcVar6 != (char *)0x0) {
          strcpy(pcVar6 + 0x10,(char *)puVar7);
          lws_callback_on_writable(wsi);
          return 0;
        }
        return -1;
      }
    }
  }
  return 1;
}

Assistant:

int
lws_return_http_status(struct lws *wsi, unsigned int code,
		       const char *html_body)
{
	struct lws_context *context = lws_get_context(wsi);
	struct lws_context_per_thread *pt = &context->pt[(int)wsi->tsi];
	unsigned char *p = pt->serv_buf + LWS_PRE;
	unsigned char *start = p;
	unsigned char *end = p + context->pt_serv_buf_size - LWS_PRE;
	char *body = (char *)start + context->pt_serv_buf_size - 512;
	int n = 0, m = 0, len;
	char slen[20];

	if (!wsi->vhost) {
		lwsl_err("%s: wsi not bound to vhost\n", __func__);

		return 1;
	}
#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
	if (!wsi->handling_404 &&
	    wsi->vhost->http.error_document_404 &&
	    code == HTTP_STATUS_NOT_FOUND)
		/* we should do a redirect, and do the 404 there */
		if (lws_http_redirect(wsi, HTTP_STATUS_FOUND,
			       (uint8_t *)wsi->vhost->http.error_document_404,
			       (int)strlen(wsi->vhost->http.error_document_404),
			       &p, end) > 0)
			return 0;
#endif

	/* if the redirect failed, just do a simple status */
	p = start;

	if (!html_body)
		html_body = "";

	if (lws_add_http_header_status(wsi, code, &p, end))
		return 1;

	if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HTTP_CONTENT_TYPE,
					 (unsigned char *)"text/html", 9,
					 &p, end))
		return 1;

	len = lws_snprintf(body, 510, "<html><head>"
		"<meta charset=utf-8 http-equiv=\"Content-Language\" "
			"content=\"en\"/>"
		"<link rel=\"stylesheet\" type=\"text/css\" "
			"href=\"/error.css\"/>"
		"</head><body><h1>%u</h1>%s</body></html>", code, html_body);


	n = lws_snprintf(slen, 12, "%d", len);
	if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HTTP_CONTENT_LENGTH,
					 (unsigned char *)slen, n, &p, end))
		return 1;

	if (lws_finalize_http_header(wsi, &p, end))
		return 1;

#if defined(LWS_WITH_HTTP2)
	if (wsi->mux_substream) {

		/*
		 * for HTTP/2, the headers must be sent separately, since they
		 * go out in their own frame.  That puts us in a bind that
		 * we won't always be able to get away with two lws_write()s in
		 * sequence, since the first may use up the writability due to
		 * the pipe being choked or SSL_WANT_.
		 *
		 * However we do need to send the human-readable body, and the
		 * END_STREAM.
		 *
		 * Solve it by writing the headers now...
		 */
#if defined(LWS_WITH_DETAILED_LATENCY)
		wsi->detlat.earliest_write_req_pre_write = lws_now_usecs();
#endif
		m = lws_write(wsi, start, lws_ptr_diff(p, start),
			      LWS_WRITE_HTTP_HEADERS);
		if (m != lws_ptr_diff(p, start))
			return 1;

		/*
		 * ... but stash the body and send it as a priority next
		 * handle_POLLOUT
		 */
		wsi->http.tx_content_length = len;
		wsi->http.tx_content_remain = len;

		wsi->h2.pending_status_body = lws_malloc(len + LWS_PRE + 1,
							"pending status body");
		if (!wsi->h2.pending_status_body)
			return -1;

		strcpy(wsi->h2.pending_status_body + LWS_PRE, body);
		lws_callback_on_writable(wsi);

		return 0;
	} else
#endif
	{
		/*
		 * for http/1, we can just append the body after the finalized
		 * headers and send it all in one go.
		 */

		n = lws_ptr_diff(p, start) + len;
		memcpy(p, body, len);
		m = lws_write(wsi, start, n, LWS_WRITE_HTTP);
		if (m != n)
			return 1;
	}

	return m != n;
}